

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# junction.cpp
# Opt level: O2

void __thiscall Junction::convertUnits(Junction *this,Network *nw)

{
  list<Demand,_std::allocator<Demand>_> *this_00;
  double dVar1;
  _List_node_base *p_Var2;
  iterator __end1;
  double dVar3;
  double dVar4;
  
  (this->super_Node).elev = (this->super_Node).elev / (nw->units).factors[1];
  (this->super_Node).initQual = (this->super_Node).initQual / (nw->units).factors[8];
  this_00 = &this->demands;
  if ((this->demands).super__List_base<Demand,_std::allocator<Demand>_>._M_impl._M_node._M_size == 0
     ) {
    std::__cxx11::list<Demand,_std::allocator<Demand>_>::push_back(this_00,&this->primaryDemand);
  }
  dVar3 = (nw->units).factors[5];
  p_Var2 = (_List_node_base *)this_00;
  while (p_Var2 = (((_List_base<Demand,_std::allocator<Demand>_> *)&p_Var2->_M_next)->_M_impl).
                  _M_node.super__List_node_base._M_next, p_Var2 != (_List_node_base *)this_00) {
    p_Var2[1]._M_next = (_List_node_base *)((double)p_Var2[1]._M_next / dVar3);
  }
  if (this->emitter != (Emitter *)0x0) {
    Emitter::convertUnits(this->emitter,nw);
  }
  dVar3 = this->pMin;
  if ((dVar3 == -999999999.9) && (!NAN(dVar3))) {
    dVar3 = (nw->options).valueOptions[3];
    this->pMin = dVar3;
  }
  dVar4 = this->pFull;
  if ((dVar4 == -999999999.9) && (!NAN(dVar4))) {
    dVar4 = (nw->options).valueOptions[4];
    this->pFull = dVar4;
  }
  dVar1 = (nw->units).factors[4];
  this->pMin = dVar3 / dVar1;
  this->pFull = dVar4 / dVar1;
  return;
}

Assistant:

void Junction::convertUnits(Network* nw)
{
    // ... convert elevation & initial quality units

    elev /= nw->ucf(Units::LENGTH);
    initQual /= nw->ucf(Units::CONCEN);

    // ... if no demand categories exist, add primary demand to list

    if (demands.size() == 0) demands.push_back(primaryDemand);

    // ... convert flow units for base demand in each demand category

    double qcf = nw->ucf(Units::FLOW);
    for (Demand& demand : demands)
    {
        demand.baseDemand /= qcf;
    }

    // ... convert emitter flow units

    if (emitter) emitter->convertUnits(nw);

    // ... use global pressure limits if no local limits assigned

    if ( pMin == MISSING )  pMin = nw->option(Options::MINIMUM_PRESSURE);
    if ( pFull == MISSING ) pFull = nw->option(Options::SERVICE_PRESSURE);

    // ... convert units of pressure limits

    double pUcf = nw->ucf(Units::PRESSURE);
    pMin /= pUcf;
    pFull /= pUcf;
}